

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::Transform(ON_Mesh *this,ON_Xform *xform)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ON_MeshCurvatureStats *this_00;
  ON_SurfaceCurvature OVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ON_BoundingBox *N;
  long lVar12;
  float *vector;
  ON_SurfaceCurvature *pOVar13;
  long lVar14;
  int j;
  ON_BoundingBox transformed_bbox;
  ON_BoundingBox bbox;
  double local_108;
  ON_BoundingBox local_e8;
  ON_BoundingBox local_b0 [2];
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  iVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (iVar11 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
LAB_004fd907:
    bVar9 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
    N = (ON_BoundingBox *)
        ON_3dPoint::operator[]((this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a,0);
    ON_TransformPointList(3,false,iVar11,3,(double *)N,xform);
    local_108 = ON_Xform::Determinant(xform,(double *)0x0);
    if (!bVar9) goto LAB_004fd970;
    UpdateSinglePrecisionVertices(this);
  }
  else {
    ON_Geometry::BoundingBox(local_b0,&this->super_ON_Geometry);
    local_e8.m_max.y = local_b0[0].m_max.y;
    local_e8.m_max.z = local_b0[0].m_max.z;
    local_e8.m_min.z = local_b0[0].m_min.z;
    local_e8.m_max.x = local_b0[0].m_max.x;
    local_e8.m_min.x = local_b0[0].m_min.x;
    local_e8.m_min.y = local_b0[0].m_min.y;
    ON_BoundingBox::Transform(&local_e8,xform);
    bVar9 = ON_BeyondSinglePrecision(local_b0,(ON_Xform *)0x0);
    if (((bVar9) || (bVar9 = ON_BeyondSinglePrecision(&local_e8,(ON_Xform *)0x0), bVar9)) &&
       (UpdateDoublePrecisionVertices(this),
       iVar11 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) goto LAB_004fd907;
    if (-1 < (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
      (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
    }
    local_108 = ON_Xform::Determinant(xform,(double *)0x0);
LAB_004fd970:
    bVar10 = false;
    N = (ON_BoundingBox *)ON_3fPoint::operator[]((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a,0)
    ;
    bVar9 = ON_TransformPointList(3,false,iVar11,3,(float *)N,xform);
    if (!bVar9) goto LAB_004fdbf2;
  }
  ON_MappingTag::Transform(&this->m_Ctag,xform);
  ON_MappingTag::Transform(&this->m_Ttag,xform);
  lVar12 = (long)(this->m_TC).m_count;
  if (0 < lVar12) {
    lVar14 = 0;
    do {
      ON_MappingTag::Transform
                ((ON_MappingTag *)((((this->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar14 + -8),
                 xform);
      lVar14 = lVar14 + 0xb8;
    } while (lVar12 * 0xb8 - lVar14 != 0);
  }
  iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  bVar9 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar3;
  if ((local_108 != 0.0) || (NAN(local_108))) {
    bVar10 = true;
    if (!bVar9 && iVar3 >= 1) {
      N = local_b0;
      ON_Xform::ON_Xform((ON_Xform *)N);
      dVar2 = ON_Xform::GetSurfaceNormalXform(xform,(ON_Xform *)N);
      vector = ON_3fVector::operator[]((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a,0);
      bVar10 = ON_TransformVectorList(3,iVar11,3,vector,(ON_Xform *)N);
      if (dVar2 < 0.0) {
        FlipVertexNormals(this);
      }
      UnitizeVertexNormals(this);
    }
    if (bVar10 != false) {
      iVar11 = (this->m_F).m_count;
      goto LAB_004fdaae;
    }
  }
  else if (bVar9 || iVar3 < 1) {
    iVar11 = (this->m_F).m_count;
    bVar10 = true;
LAB_004fdaae:
    if ((0 < iVar11) && ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar11)) {
      ComputeFaceNormals(this);
    }
  }
  else {
    ComputeFaceNormals(this);
    ComputeVertexNormals(this);
    bVar10 = true;
  }
  if ((((bVar10 != false) &&
       (iVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar11)) &&
      ((this->m_K).m_count == iVar11)) && (1.490116119385e-08 < ABS(ABS(local_108) + -1.0))) {
    if ((local_108 != 0.0) || (NAN(local_108))) {
      dVar2 = xform->m_xform[0][0];
      if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar2 == xform->m_xform[1][1])) {
        pdVar1 = xform->m_xform[2] + 2;
        if (((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) &&
           (ABS(local_108 - dVar2 * dVar2 * dVar2) <= local_108 * 1.490116119385e-08)) {
          pOVar13 = (this->m_K).m_a;
          do {
            dVar5 = pOVar13->k2 * (1.0 / dVar2);
            OVar4.k2._0_4_ = SUB84(dVar5,0);
            OVar4.k1 = pOVar13->k1 * (1.0 / dVar2);
            OVar4.k2._4_4_ = (int)((ulong)dVar5 >> 0x20);
            *pOVar13 = OVar4;
            pOVar13 = pOVar13 + 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          lVar12 = 0;
          do {
            this_00 = this->m_kstat[lVar12];
            if (this_00 != (ON_MeshCurvatureStats *)0x0) {
              ON_MeshCurvatureStats::Set
                        (this_00,this_00->m_style,(this->m_K).m_count,(this->m_K).m_a,
                         (ON_3fVector *)N,0.0);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          goto LAB_004fdbf2;
        }
      }
    }
    bVar10 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xbe6,"","ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
  }
LAB_004fdbf2:
  dVar8 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
  dVar7 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
  dVar6 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
  dVar5 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
  dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
  (this->m_vertex_bbox).m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  (this->m_vertex_bbox).m_max.z = dVar8;
  (this->m_vertex_bbox).m_min.z = dVar6;
  (this->m_vertex_bbox).m_max.x = dVar7;
  (this->m_vertex_bbox).m_min.x = dVar2;
  (this->m_vertex_bbox).m_min.y = dVar5;
  ON_BoundingBoxCache::RemoveAllBoundingBoxes(&this->m_tight_bbox_cache);
  *(float *)((long)(this->m_nbox + 1) + 4) = -1.0;
  *(float *)((long)(this->m_nbox + 1) + 8) = -1.0;
  *(float *)((long)(this->m_nbox + 0) + 0) = 1.0;
  *(float *)((long)(this->m_nbox + 0) + 4) = 1.0;
  *(undefined8 *)(this->m_nbox[0] + 2) = 0xbf8000003f800000;
  if (ABS(local_108) <= 2.3283064365386963e-10) {
    ON_MeshTopology::Destroy(&this->m_top);
  }
  return bVar10;
}

Assistant:

bool ON_Mesh::Transform( 
       const ON_Xform& xform
       )
{
  // Transform user data before doing sanity checks in case rogue code
  // damages m_V[], m_dV[] or other data members.
  TransformUserData(xform);
	DestroyTree();

  const unsigned int vertex_count = VertexUnsignedCount();

  const bool bIsValid_fV = (vertex_count == m_V.UnsignedCount());
  if (false == bIsValid_fV)
    m_V.SetCount(0);

  bool bIsValid_dV = (vertex_count == m_dV.UnsignedCount());

  // 2 Jan 2020 S. Baer (RH-54464)
  // If the transform is moving the mesh into or out of "beyond single precision",
  // set up double precision vertices in order to get our best possible precision
  // after the transform.
  if (false == bIsValid_dV)
  {
    ON_BoundingBox bbox = BoundingBox();
    ON_BoundingBox transformed_bbox = bbox;
    transformed_bbox.Transform(xform);
    if (ON_BeyondSinglePrecision(bbox, nullptr) || ON_BeyondSinglePrecision(transformed_bbox, nullptr))
    {
      UpdateDoublePrecisionVertices();
      bIsValid_dV = (vertex_count == m_dV.UnsignedCount());
    }
  }


  if (false == bIsValid_dV)
    m_dV.SetCount(0);

  const bool bSyncheddV = bIsValid_fV && bIsValid_dV && HasSynchronizedDoubleAndSinglePrecisionVertices();

  if (bIsValid_dV)
    ON_TransformPointList(3, false, vertex_count, 3, &m_dV[0][0], xform);
  
  double d = xform.Determinant();
  bool rc = false;
  if ( bSyncheddV )
  {
    // transforming the double precision vertices is the 
    // best way to set the floats.
    UpdateSinglePrecisionVertices();
    rc = true;
  }
  else if ( bIsValid_fV )
  {
    rc = ON_TransformPointList( 3, false, vertex_count, 3, &m_V[0][0], xform );
  }

  if ( rc )
  {
    m_Ctag.Transform(xform);
    m_Ttag.Transform(xform);
    int tci, tccnt = m_TC.Count();
    for ( tci = 0; tci < tccnt; tci++ )
    {
      m_TC[tci].m_tag.Transform(xform);
    }
  }

  if ( rc && 0.0 == d )
  {
    // mesh has been squashed to a plane (or worse)
    if ( HasVertexNormals() )
    {
      ComputeFaceNormals();
      ComputeVertexNormals();
    }
    else if ( HasFaceNormals() )
    {
      ComputeFaceNormals();
    }
  }
  else if ( rc )
  {
    if ( HasVertexNormals() ) 
    {
      // See http://www.gignews.com/realtime020100.htm or these
      // references.
      //
      // 1. Hanrahan, Pat, 
      //    "A Survey of Ray-Surface Intersection Algorithms", 
      //     chapter 3 in Andrew Glassner (editor), 
      //     An Introduction to Ray Tracing, 
      //     Academic Press Inc., London, 1989.
      //
      // 2. Turkowski, Ken, 
      //    "Properties of Surface-Normal Transformations", 
      //     in Andrew Glassner (editor), 
      //     Graphics Gems, Academic Press, Inc., 
      //     pp. 539-547, 1990. 
      ON_Xform N_xform;
      const double det = xform.GetSurfaceNormalXform(N_xform);
      rc = ON_TransformVectorList( 3, vertex_count, 3, &m_N[0][0], N_xform )?true:false;
      if ( det < 0.0 )
      {
        FlipVertexNormals();
      }
      UnitizeVertexNormals();
    }

    if ( rc && HasFaceNormals() ) 
    {
      ComputeFaceNormals();
    }
  }

  if ( rc && HasPrincipalCurvatures() ) 
  {
    if ( fabs(fabs(d) - 1.0) > ON_SQRT_EPSILON ) 
    {
      // If it's a uniform scale, handle it, otherwise we can't do it.
      double scale = xform.m_xform[0][0];
      if ( 0.0 != scale && 0.0 != d
           && scale == xform.m_xform[1][1] 
           && scale == xform.m_xform[2][2] 
           && fabs(d - scale*scale*scale) <= d*ON_SQRT_EPSILON )
      {
        // uniform scale
        const double ks = 1.0/scale;
        ON_SurfaceCurvature* sc = m_K.Array();
        int ki = m_K.Count();
        while ( ki-- )
        {
          sc->k1 *= ks;
          sc->k2 *= ks;
          sc++;
        }

        // update curvature stats.
        for ( int j = 0; j < 4; j++ )
        {
          if ( m_kstat[j] )
            m_kstat[j]->Set( m_kstat[j]->m_style,m_K.Count(),m_K.Array(),m_N.Array() );
        }
      }
      else
      {
        ON_ERROR("ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
        rc = false;
      }
    }
  }

  InvalidateVertexBoundingBox();
  InvalidateVertexNormalBoundingBox();
  if ( fabs(d) <= ON_ZERO_TOLERANCE )
    DestroyTopology(); // transform may not be one-to-one on vertices

  return rc;
}